

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O3

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestTailCallee::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  undefined8 extraout_RDX;
  undefined6 in_register_00000032;
  DispatchCallResult DVar3;
  undefined8 uVar2;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  if ((int)context.hook == 0) {
    (**(code **)(lVar1 + 8))(this);
    *(undefined2 *)&this->field_0x8 = 0x100;
    uVar2 = extraout_RDX;
  }
  else {
    DVar3 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)((long)CONCAT62(in_register_00000032,methodId) +
                               *(long *)(lVar1 + -0x18)),0x2e2c5c,0xe23b);
    uVar2 = DVar3._8_8_;
  }
  DVar3.isStreaming = (bool)(char)uVar2;
  DVar3.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar3._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar3.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar3;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestTailCallee::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        foo(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestTailCallee::FooParams,  ::capnproto_test::capnp::test::TestTailCallee::TailResult>(context)),
        false,
        true
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestTailCallee",
          0xddd699207eb8e23bull, methodId);
  }
}